

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt_env_infrastructure.cpp
# Opt level: O1

bool __thiscall
so_5::env_infrastructures::default_mt::impl::mt_env_infrastructure_t::final_deregister_coop
          (mt_env_infrastructure_t *this,string *coop_name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  string local_30;
  
  local_30._M_dataplus._M_p = (coop_name->_M_dataplus)._M_p;
  paVar1 = &coop_name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p == paVar1) {
    local_30.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_30.field_2._8_8_ = *(undefined8 *)((long)&coop_name->field_2 + 8);
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  }
  else {
    local_30.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_30._M_string_length = coop_name->_M_string_length;
  (coop_name->_M_dataplus)._M_p = (pointer)paVar1;
  coop_name->_M_string_length = 0;
  (coop_name->field_2)._M_local_buf[0] = '\0';
  bVar2 = coop_repo_t::final_deregister_coop(&this->m_coop_repo,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return bVar2;
}

Assistant:

bool
mt_env_infrastructure_t::final_deregister_coop(
	std::string coop_name )
	{
		return m_coop_repo.final_deregister_coop( std::move(coop_name) );
	}